

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature2.cpp
# Opt level: O2

void __thiscall
adios2::core::callback::Signature2::Signature2
          (Signature2 *this,
          function<void_(void_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_long,_const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>
          *function,Params *parameters)

{
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"Signature2",&local_59);
  std::__cxx11::string::string((string *)&local_58,"callback",&local_5a);
  Operator::Operator(&this->super_Operator,&local_38,CALLBACK_SIGNATURE2,&local_58,parameters);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_Operator)._vptr_Operator = (_func_int **)&PTR__Signature2_0081ac90;
  std::
  function<void_(void_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_long,_const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>
  ::function(&this->m_Function,function);
  return;
}

Assistant:

Signature2::Signature2(
    const std::function<void(void *, const std::string &, const std::string &, const std::string &,
                             const size_t, const Dims &, const Dims &, const Dims &)> &function,
    const Params &parameters)
: Operator("Signature2", Operator::CALLBACK_SIGNATURE2, "callback", parameters),
  m_Function(function)
{
}